

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_clamp(Impl *this,SPIRVModule *module,Id type_id)

{
  initializer_list<unsigned_int> __l;
  bool bVar1;
  Id IVar2;
  Function *pFVar3;
  Block *pBVar4;
  Instruction *pIVar5;
  size_t sVar6;
  value_type local_140;
  Instruction *local_130;
  Instruction *loaded_result;
  Instruction *cmp;
  Instruction *store;
  Instruction *clamp;
  Instruction *pIStack_108;
  Id std450;
  Instruction *output_chain;
  Instruction *load;
  Instruction *input_chain;
  Instruction *iter;
  Instruction *phi;
  Block *merge;
  Block *header;
  Instruction *len;
  undefined1 local_c0 [4];
  Id output_id;
  allocator_type local_a5;
  Id local_a4;
  Id local_a0;
  Id local_9c;
  iterator local_98;
  undefined8 local_90;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_88;
  Function *local_70;
  Function *func;
  Id float_ptr_type;
  Id bool_type;
  Id f32_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  CoopMatConvOp *ops;
  iterator __end1;
  iterator __begin1;
  Vector<CoopMatConvOp> *__range1;
  Id type_id_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  __end1 = std::
           vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
           ::begin(&this->coop_mat_conv_ids);
  ops = (CoopMatConvOp *)
        std::
        vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
        ::end(&this->coop_mat_conv_ids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
                                *)&ops);
    if (!bVar1) {
      entry = spv::Builder::getBuildPoint(&this->builder);
      _f32_type = (Block *)0x0;
      bool_type = spv::Builder::makeUintType(&this->builder,0x20);
      float_ptr_type = spv::Builder::makeFloatType(&this->builder,0x20);
      func._4_4_ = spv::Builder::makeBoolType(&this->builder);
      local_a4 = spv::Builder::makePointer(&this->builder,StorageClassFunction,type_id);
      local_a0 = float_ptr_type;
      local_9c = float_ptr_type;
      local_98 = &local_a4;
      local_90 = 3;
      __l._M_len = 3;
      __l._M_array = local_98;
      func._0_4_ = local_a4;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_88,__l,&local_a5);
      memset(local_c0,0,0x18);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                *)local_c0);
      pFVar3 = spv::Builder::makeFunctionEntry
                         (&this->builder,DecorationMax,type_id,"CoopMatClamp",&local_88,
                          (Vector<dxil_spv::Vector<Decoration>_> *)local_c0,(Block **)&f32_type);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 *)local_c0);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_88);
      local_70 = pFVar3;
      len._4_4_ = create_variable(this,StorageClassFunction,type_id,"coop_output");
      header = (Block *)spv::Builder::addInstruction
                                  (&this->builder,bool_type,OpCooperativeMatrixLengthKHR);
      sVar6 = (size_t)type_id;
      spv::Instruction::addIdOperand((Instruction *)header,type_id);
      pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
      IVar2 = spv::Builder::getUniqueId(&this->builder);
      sVar6 = (size_t)IVar2;
      spv::Block::Block(pBVar4,IVar2,local_70);
      merge = pBVar4;
      pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
      IVar2 = spv::Builder::getUniqueId(&this->builder);
      spv::Block::Block(pBVar4,IVar2,local_70);
      phi = (Instruction *)pBVar4;
      spv::Builder::createBranch(&this->builder,merge);
      spv::Builder::setBuildPoint(&this->builder,merge);
      iter = spv::Builder::addInstruction(&this->builder,bool_type,OpPhi);
      pIVar5 = spv::Builder::addInstruction(&this->builder,bool_type,OpIAdd);
      input_chain = pIVar5;
      IVar2 = spv::Instruction::getResultId(iter);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = input_chain;
      IVar2 = spv::Builder::makeUintConstant(&this->builder,1,false);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = iter;
      IVar2 = spv::Builder::makeUintConstant(&this->builder,0,false);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = iter;
      IVar2 = spv::Block::getId(_f32_type);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = iter;
      IVar2 = spv::Instruction::getResultId(input_chain);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = iter;
      IVar2 = spv::Block::getId(merge);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      IVar2 = spv::Builder::makePointer(&this->builder,StorageClassFunction,float_ptr_type);
      pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpInBoundsAccessChain);
      load = pIVar5;
      IVar2 = spv::Function::getParamId(local_70,0);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = load;
      IVar2 = spv::Instruction::getResultId(iter);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = spv::Builder::addInstruction(&this->builder,float_ptr_type,OpLoad);
      output_chain = pIVar5;
      IVar2 = spv::Instruction::getResultId(load);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      IVar2 = spv::Builder::makePointer(&this->builder,StorageClassFunction,float_ptr_type);
      pIStack_108 = spv::Builder::addInstruction(&this->builder,IVar2,OpInBoundsAccessChain);
      spv::Instruction::addIdOperand(pIStack_108,len._4_4_);
      pIVar5 = pIStack_108;
      IVar2 = spv::Instruction::getResultId(iter);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      clamp._4_4_ = spv::Builder::import(&this->builder,"GLSL.std.450");
      store = spv::Builder::addInstruction(&this->builder,float_ptr_type,OpExtInst);
      spv::Instruction::addIdOperand(store,clamp._4_4_);
      spv::Instruction::addImmediateOperand(store,0x2b);
      pIVar5 = store;
      IVar2 = spv::Instruction::getResultId(output_chain);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = store;
      IVar2 = spv::Function::getParamId(local_70,1);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = store;
      IVar2 = spv::Function::getParamId(local_70,2);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = spv::Builder::addInstruction(&this->builder,OpStore);
      cmp = pIVar5;
      IVar2 = spv::Instruction::getResultId(pIStack_108);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = cmp;
      IVar2 = spv::Instruction::getResultId(store);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpULessThan);
      loaded_result = pIVar5;
      IVar2 = spv::Instruction::getResultId(input_chain);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = loaded_result;
      IVar2 = spv::Instruction::getResultId((Instruction *)header);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      spv::Builder::createLoopMerge(&this->builder,(Block *)phi,merge,0);
      IVar2 = spv::Instruction::getResultId(loaded_result);
      spv::Builder::createConditionalBranch(&this->builder,IVar2,merge,(Block *)phi);
      spv::Builder::setBuildPoint(&this->builder,(Block *)phi);
      local_130 = spv::Builder::addInstruction(&this->builder,type_id,OpLoad);
      spv::Instruction::addIdOperand(local_130,len._4_4_);
      IVar2 = spv::Instruction::getResultId(local_130);
      spv::Builder::makeReturn(&this->builder,false,IVar2);
      spv::Builder::setBuildPoint(&this->builder,entry);
      local_140.input_type = type_id;
      local_140.output_type = type_id;
      local_140.func_id = spv::Function::getId(local_70);
      local_140.call = CoopMatClamp;
      std::
      vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
      ::push_back(&this->coop_mat_conv_ids,&local_140);
      IVar2 = spv::Function::getId(local_70);
      return IVar2;
    }
    current_build_point =
         (Block *)__gnu_cxx::
                  __normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
                  ::operator*(&__end1);
    if ((*(Id *)&current_build_point->_vptr_Block == type_id) &&
       (*(HelperCall *)
         ((long)&(current_build_point->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) == CoopMatClamp)) break;
    __gnu_cxx::
    __normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
    ::operator++(&__end1);
  }
  return *(Id *)&(current_build_point->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_clamp(SPIRVModule &module, spv::Id type_id)
{
	for (auto &ops : coop_mat_conv_ids)
		if (ops.input_type == type_id && ops.call == HelperCall::CoopMatClamp)
			return ops.func_id;
	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id bool_type = builder.makeBoolType();

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id float_ptr_type = builder.makePointer(spv::StorageClassFunction, type_id);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       "CoopMatClamp",
	                                       { float_ptr_type, f32_type, f32_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, type_id, "coop_output");

	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(type_id);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassFunction, f32_type), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(f32_type, spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		auto *output_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassFunction, f32_type), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());

		spv::Id std450 = builder.import("GLSL.std.450");
		auto *clamp = builder.addInstruction(f32_type, spv::OpExtInst);
		clamp->addIdOperand(std450);
		clamp->addImmediateOperand(GLSLstd450FClamp);
		clamp->addIdOperand(load->getResultId());
		clamp->addIdOperand(func->getParamId(1));
		clamp->addIdOperand(func->getParamId(2));

		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(clamp->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(type_id, spv::OpLoad);
	loaded_result->addIdOperand(output_id);

	builder.makeReturn(false, loaded_result->getResultId());

	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ type_id, type_id, func->getId(), HelperCall::CoopMatClamp });
	return func->getId();
}